

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O0

void WriteDDintoBLIFfile(FILE *pFile,DdNode *Func,char *OutputName,char *Prefix,char **InputNames)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  char **ppcVar5;
  char **local_88;
  int *pSlot;
  DdNode *Then;
  DdNode *ElseR;
  DdNode *Else;
  DdNode *Node;
  long mask;
  long diff;
  long refAddr;
  st__generator *gen;
  st__table *visited;
  char **ppcStack_30;
  int i;
  char **InputNames_local;
  char *Prefix_local;
  char *OutputName_local;
  DdNode *Func_local;
  FILE *pFile_local;
  
  refAddr = 0;
  ppcStack_30 = InputNames;
  InputNames_local = (char **)Prefix;
  Prefix_local = OutputName;
  OutputName_local = (char *)Func;
  Func_local = (DdNode *)pFile;
  gen = (st__generator *)st__init_table(st__ptrcmp,st__ptrhash);
  cuddCollectNodes((DdNode *)((ulong)OutputName_local & 0xfffffffffffffffe),(st__table *)gen);
  diff = (ulong)OutputName_local & 0xfffffffffffffffe;
  mask = 0;
  refAddr = (long)st__init_gen((st__table *)gen);
  while (iVar1 = st__gen((st__generator *)refAddr,(char **)&Else,(char **)0x0), iVar1 != 0) {
    mask = diff ^ (ulong)Else | mask;
  }
  st__free_gen((st__generator *)refAddr);
  refAddr = 0;
  visited._4_4_ = 0;
  while ((visited._4_4_ < 0x40 &&
         (Node = (DdNode *)(long)((1 << ((byte)visited._4_4_ & 0x1f)) + -1), (long)Node < mask))) {
    visited._4_4_ = visited._4_4_ + 4;
  }
  fprintf((FILE *)Func_local,".names %s%lx %s\n",InputNames_local,
          ((ulong)Node & (ulong)OutputName_local & 0xfffffffffffffffe) / 0x28,Prefix_local);
  pcVar4 = "1";
  if (((ulong)OutputName_local & 1) != 0) {
    pcVar4 = "0";
  }
  fprintf((FILE *)Func_local,"%s 1\n",pcVar4);
  refAddr = (long)st__init_gen((st__table *)gen);
  while( true ) {
    while( true ) {
      iVar1 = st__gen((st__generator *)refAddr,(char **)&Else,(char **)0x0);
      if (iVar1 == 0) {
        st__free_gen((st__generator *)refAddr);
        refAddr = 0;
        st__free_table((st__table *)gen);
        return;
      }
      if (Else->index != 0x7fffffff) break;
      fprintf((FILE *)Func_local,".names %s%lx\n",InputNames_local,
              ((ulong)Node & (ulong)Else) / 0x28);
      pcVar4 = "1";
      if ((Else->type).value == 0.0) {
        pcVar4 = "0";
      }
      fprintf((FILE *)Func_local," %s\n",pcVar4);
    }
    ElseR = (Else->type).kids.E;
    Then = (DdNode *)((ulong)ElseR & 0xfffffffffffffffe);
    pSlot = (int *)(Else->type).kids.T;
    if (ppcStack_30[Else->index] == (char *)0x0) break;
    if (ElseR == Then) {
      fprintf((FILE *)Func_local,".names %s %s%lx %s%lx %s%lx\n",ppcStack_30[Else->index],
              InputNames_local,((ulong)Node & (ulong)Then) / 0x28,InputNames_local,
              ((ulong)Node & (ulong)pSlot) / 0x28,InputNames_local,
              ((ulong)Node & (ulong)Else) / 0x28);
      fprintf((FILE *)Func_local,"01- 1\n");
      fprintf((FILE *)Func_local,"1-1 1\n");
    }
    else {
      uVar2 = ((ulong)Node & (ulong)pSlot) / 0x28;
      uVar3 = ((ulong)Node & (ulong)Else) / 0x28;
      ppcVar5 = InputNames_local;
      fprintf((FILE *)Func_local,".names %s %s%lx_i %s%lx %s%lx\n",ppcStack_30[Else->index],
              InputNames_local,((ulong)Node & (ulong)Then) / 0x28,InputNames_local,uVar2,
              InputNames_local,uVar3);
      fprintf((FILE *)Func_local,"01- 1\n");
      fprintf((FILE *)Func_local,"1-1 1\n");
      iVar1 = st__find((st__table *)gen,(char *)Then,&local_88);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casCore.c"
                      ,0x38c,"void WriteDDintoBLIFfile(FILE *, DdNode *, char *, char *, char **)");
      }
      if (*(int *)local_88 == 0) {
        *(int *)local_88 = 1;
        fprintf((FILE *)Func_local,".names %s%lx %s%lx_i\n",InputNames_local,
                ((ulong)Node & (ulong)Then) / 0x28,InputNames_local,
                ((ulong)Node & (ulong)Then) / 0x28,uVar2,ppcVar5,uVar3);
        fprintf((FILE *)Func_local,"0 1\n");
      }
    }
  }
  __assert_fail("InputNames[Node->index]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casCore.c"
                ,0x376,"void WriteDDintoBLIFfile(FILE *, DdNode *, char *, char *, char **)");
}

Assistant:

void WriteDDintoBLIFfile( FILE * pFile, DdNode * Func, char * OutputName, char * Prefix, char ** InputNames )
// writes the main part of the BLIF file 
// Func is a BDD or a 0-1 ADD to be written
// OutputName is the name of the output
// Prefix is attached to each intermendiate signal to make it unique
// InputNames are the names of the input signals
// (some part of the code is borrowed from Cudd_DumpDot())
{
    int i;
    st__table * visited;
    st__generator * gen = NULL;
    long refAddr, diff, mask;
    DdNode * Node, * Else, * ElseR, * Then;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash );

    /* Collect all the nodes of this DD in the symbol table. */
    cuddCollectNodes( Cudd_Regular(Func), visited );

    /* Find how many most significant hex digits are identical
       ** in the addresses of all the nodes. Build a mask based
       ** on this knowledge, so that digits that carry no information
       ** will not be printed. This is done in two steps.
       **  1. We scan the symbol table to find the bits that differ
       **     in at least 2 addresses.
       **  2. We choose one of the possible masks. There are 8 possible
       **     masks for 32-bit integer, and 16 possible masks for 64-bit
       **     integers.
     */

    /* Find the bits that are different. */
    refAddr = ( long )Cudd_Regular(Func);
    diff = 0;
    gen = st__init_gen( visited );
    while ( st__gen( gen, ( const char ** ) &Node, NULL ) )
    {
        diff |= refAddr ^ ( long ) Node;
    }
    st__free_gen( gen );
    gen = NULL;

    /* Choose the mask. */
    for ( i = 0; ( unsigned ) i < 8 * sizeof( long ); i += 4 )
    {
        mask = ( 1 << i ) - 1;
        if ( diff <= mask )
            break;
    }


    // write the buffer for the output
    fprintf( pFile, ".names %s%lx %s\n", Prefix, ( mask & (long)Cudd_Regular(Func) ) / sizeof(DdNode), OutputName ); 
    fprintf( pFile, "%s 1\n", (Cudd_IsComplement(Func))? "0": "1" );


    gen = st__init_gen( visited );
    while ( st__gen( gen, ( const char ** ) &Node, NULL ) )
    {
        if ( Node->index == CUDD_MAXINDEX )
        {
            // write the terminal node
            fprintf( pFile, ".names %s%lx\n", Prefix, ( mask & (long)Node ) / sizeof(DdNode) );
            fprintf( pFile, " %s\n", (cuddV(Node) == 0.0)? "0": "1" );
            continue;
        }

        Else  = cuddE(Node);
        ElseR = Cudd_Regular(Else);
        Then  = cuddT(Node);

        assert( InputNames[Node->index] );
        if ( Else == ElseR )
        { // no inverter
            fprintf( pFile, ".names %s %s%lx %s%lx %s%lx\n", InputNames[Node->index],                           
                              Prefix, ( mask & (long)ElseR ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Then  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Node  ) / sizeof(DdNode)   );
            fprintf( pFile, "01- 1\n" );
            fprintf( pFile, "1-1 1\n" );
        }
        else
        { // inverter
            int * pSlot;
            fprintf( pFile, ".names %s %s%lx_i %s%lx %s%lx\n", InputNames[Node->index],                         
                              Prefix, ( mask & (long)ElseR ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Then  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Node  ) / sizeof(DdNode)   );
            fprintf( pFile, "01- 1\n" );
            fprintf( pFile, "1-1 1\n" );

            // if the inverter is written, skip
            if ( ! st__find( visited, (char *)ElseR, (char ***)&pSlot ) )
                assert( 0 );
            if ( *pSlot )
                continue;
            *pSlot = 1;

            fprintf( pFile, ".names %s%lx %s%lx_i\n",  
                              Prefix, ( mask & (long)ElseR  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)ElseR  ) / sizeof(DdNode)   );
            fprintf( pFile, "0 1\n" );
        }
    }
    st__free_gen( gen );
    gen = NULL;
    st__free_table( visited );
}